

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall Instance::computeCollisionConstraint(Instance *this,Train *train)

{
  uint uVar1;
  pointer pvVar2;
  int iVar3;
  bool bVar4;
  Z3_ast_vector p_Var5;
  Z3_ast p_Var6;
  ulong uVar7;
  pointer otherTrain;
  expr startVar;
  expr_vector otherPathVars;
  pathType path;
  expr_vector otherTrainPosVars;
  expr endVar;
  ast local_118;
  undefined1 local_108 [16];
  ast_vector_tpl<z3::expr> local_f8;
  ulong local_e8;
  ulong local_e0;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> local_d8;
  ulong local_c0;
  ast local_b8;
  ast local_a8;
  ast_vector_tpl<z3::expr> local_98;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_88;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_80;
  Graph *local_78;
  size_t local_70;
  vector<z3::expr,_std::allocator<z3::expr>_> *local_68;
  Train *local_60;
  pointer local_58;
  ast local_50;
  ast local_40;
  
  pvVar2 = (this->trainPaths).
           super__Vector_base<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_80 = pvVar2[train->id].
             super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_88 = *(pointer *)
              ((long)&pvVar2[train->id].
                      super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
  if (local_80 != local_88) {
    local_78 = &this->graph;
    local_68 = &this->constraints;
    local_60 = train;
    do {
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector(&local_d8,local_80);
      local_98.super_object.m_ctx = this->c;
      p_Var5 = (Z3_ast_vector)Z3_mk_ast_vector((local_98.super_object.m_ctx)->m_ctx);
      Z3_ast_vector_inc_ref((local_98.super_object.m_ctx)->m_ctx,p_Var5);
      local_98.m_vector = p_Var5;
      if (local_d8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_d8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar7 = 0;
        do {
          local_70 = Graph::reachableInPath(local_78,&local_d8,uVar7,train->speed);
          local_e8 = uVar7;
          local_c0 = uVar7;
          if (uVar7 <= local_70) {
            do {
              uVar1 = (train->start).arrivalTime;
              uVar7 = (ulong)uVar1;
              if (uVar1 < this->maxTimeSteps - 1) {
                do {
                  local_f8.super_object.m_ctx = this->c;
                  p_Var5 = (Z3_ast_vector)Z3_mk_ast_vector((local_f8.super_object.m_ctx)->m_ctx);
                  Z3_ast_vector_inc_ref((local_f8.super_object.m_ctx)->m_ctx,p_Var5);
                  otherTrain = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                  local_58 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  local_f8.m_vector = p_Var5;
                  local_e0 = uVar7;
                  if (otherTrain != local_58) {
                    do {
                      bVar4 = Train::operator==(train,otherTrain);
                      uVar7 = local_c0;
                      if ((!bVar4 && local_c0 <= local_e8) &&
                          (otherTrain->start).arrivalTime <= local_e0) {
                        do {
                          iVar3 = (int)(local_e0 << 4);
                          z3::ast_vector_tpl<z3::expr>::operator[]
                                    ((ast_vector_tpl<z3::expr> *)&local_118,
                                     (int)(this->occupiedVars).
                                          super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[otherTrain->id].
                                          super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + iVar3);
                          bVar4 = z3::expr::is_bool((expr *)&local_118);
                          if (!bVar4) {
LAB_001054ca:
                            __assert_fail("a.is_bool()","/usr/include/z3++.h",0x609,
                                          "expr z3::operator!(const expr &)");
                          }
                          p_Var6 = (Z3_ast)Z3_mk_not((local_118.super_object.m_ctx)->m_ctx,
                                                     local_118.m_ast);
                          z3::context::check_error(local_118.super_object.m_ctx);
                          local_108._0_8_ = local_118.super_object.m_ctx;
                          local_108._8_8_ = p_Var6;
                          Z3_inc_ref((local_118.super_object.m_ctx)->m_ctx,p_Var6);
                          Z3_ast_vector_push((local_f8.super_object.m_ctx)->m_ctx,local_f8.m_vector,
                                             local_108._8_8_);
                          z3::context::check_error(local_f8.super_object.m_ctx);
                          z3::ast::~ast((ast *)local_108);
                          z3::ast::~ast(&local_118);
                          z3::ast_vector_tpl<z3::expr>::operator[]
                                    ((ast_vector_tpl<z3::expr> *)&local_118,
                                     (int)(this->occupiedVars).
                                          super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[otherTrain->id].
                                          super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x10 + iVar3);
                          bVar4 = z3::expr::is_bool((expr *)&local_118);
                          if (!bVar4) goto LAB_001054ca;
                          p_Var6 = (Z3_ast)Z3_mk_not((local_118.super_object.m_ctx)->m_ctx,
                                                     local_118.m_ast);
                          z3::context::check_error(local_118.super_object.m_ctx);
                          local_108._0_8_ = local_118.super_object.m_ctx;
                          local_108._8_8_ = p_Var6;
                          Z3_inc_ref((local_118.super_object.m_ctx)->m_ctx,p_Var6);
                          Z3_ast_vector_push((local_f8.super_object.m_ctx)->m_ctx,local_f8.m_vector,
                                             local_108._8_8_);
                          z3::context::check_error(local_f8.super_object.m_ctx);
                          z3::ast::~ast((ast *)local_108);
                          z3::ast::~ast(&local_118);
                          uVar7 = uVar7 + 1;
                        } while (uVar7 <= local_e8);
                      }
                      otherTrain = otherTrain + 1;
                      train = local_60;
                    } while (otherTrain != local_58);
                  }
                  uVar7 = local_e0;
                  z3::ast_vector_tpl<z3::expr>::operator[]
                            ((ast_vector_tpl<z3::expr> *)&local_118,
                             (int)(local_e0 << 4) +
                             (int)(this->occupiedVars).
                                  super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[train->id].
                                  super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                  local_e0 = uVar7 + 1;
                  z3::ast_vector_tpl<z3::expr>::operator[]
                            ((ast_vector_tpl<z3::expr> *)&local_40,
                             (int)local_e0 * 0x10 +
                             (int)(this->occupiedVars).
                                  super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[train->id].
                                  super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                  z3::operator&&((z3 *)&local_a8,(expr *)&local_118,(expr *)&local_40);
                  z3::array<_Z3_ast_*>::array<z3::expr>((array<_Z3_ast_*> *)local_108,&local_f8);
                  p_Var6 = (Z3_ast)Z3_mk_and((local_f8.super_object.m_ctx)->m_ctx,
                                             local_108._8_8_ & 0xffffffff,local_108._0_8_);
                  z3::context::check_error(local_f8.super_object.m_ctx);
                  local_b8.super_object.m_ctx = local_f8.super_object.m_ctx;
                  local_b8.m_ast = p_Var6;
                  Z3_inc_ref((local_f8.super_object.m_ctx)->m_ctx,p_Var6);
                  if ((__uniq_ptr_impl<_Z3_ast_*,_std::default_delete<_Z3_ast_*[]>_>)local_108._0_8_
                      != (__uniq_ptr_impl<_Z3_ast_*,_std::default_delete<_Z3_ast_*[]>_>)0x0) {
                    operator_delete__((void *)local_108._0_8_);
                  }
                  bVar4 = z3::expr::is_bool((expr *)&local_a8);
                  if (!bVar4) {
LAB_001054e9:
                    __assert_fail("a.is_bool() && b.is_bool()","/usr/include/z3++.h",0x5dc,
                                  "expr z3::implies(const expr &, const expr &)");
                  }
                  bVar4 = z3::expr::is_bool((expr *)&local_b8);
                  if (!bVar4) goto LAB_001054e9;
                  if (local_a8.super_object.m_ctx != local_b8.super_object.m_ctx) {
                    __assert_fail("a.m_ctx == b.m_ctx","/usr/include/z3++.h",0x1aa,
                                  "void z3::check_context(const object &, const object &)");
                  }
                  p_Var6 = (Z3_ast)Z3_mk_implies((local_a8.super_object.m_ctx)->m_ctx,local_a8.m_ast
                                                 ,local_b8.m_ast);
                  z3::context::check_error(local_a8.super_object.m_ctx);
                  local_50.super_object.m_ctx = local_a8.super_object.m_ctx;
                  local_50.m_ast = p_Var6;
                  Z3_inc_ref((local_a8.super_object.m_ctx)->m_ctx,p_Var6);
                  std::vector<z3::expr,_std::allocator<z3::expr>_>::emplace_back<z3::expr>
                            (local_68,(expr *)&local_50);
                  z3::ast::~ast(&local_50);
                  z3::ast::~ast(&local_b8);
                  z3::ast::~ast(&local_a8);
                  z3::ast::~ast(&local_40);
                  z3::ast::~ast(&local_118);
                  z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(&local_f8);
                  uVar7 = local_e0;
                } while (local_e0 < this->maxTimeSteps - 1);
              }
              local_e8 = local_e8 + 1;
            } while (local_e8 <= local_70);
          }
          uVar7 = local_c0 + 1;
        } while (uVar7 < (ulong)((long)local_d8.
                                       super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_d8.
                                       super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(&local_98);
      if (local_d8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_80 = local_80 + 1;
    } while (local_80 != local_88);
  }
  return;
}

Assistant:

void Instance::computeCollisionConstraint(const Train &train) {
  for (pathType path : trainPaths[train.id]) {
    expr_vector otherTrainPosVars(*c);
    for (size_t startIndex = 0; startIndex < path.size(); startIndex++) {
      size_t endIndex = graph.reachableInPath(path, startIndex, train.speed);
      for (size_t pathIndex = startIndex; pathIndex <= endIndex; pathIndex++) {

        for (size_t time = train.start.arrivalTime; time < maxTimeSteps - 1;
             time++) {
          expr_vector otherPathVars(*c);

          for (const Train &otherTrain : trains) {
            if (train == otherTrain || otherTrain.start.arrivalTime > time)
              continue;
            for (size_t betweenIndex = startIndex; betweenIndex <= pathIndex;
                 betweenIndex++) {

              otherPathVars.push_back(
                  !occupiedVars[otherTrain.id][time][path[betweenIndex]->id]);
              otherPathVars.push_back(!occupiedVars[otherTrain.id][time + 1]
                                                   [path[betweenIndex]->id]);
            }
          }

          expr startVar = occupiedVars[train.id][time][path[startIndex]->id];
          expr endVar = occupiedVars[train.id][time + 1][path[pathIndex]->id];
          constraints.push_back(
              implies(startVar && endVar, mk_and(otherPathVars)));
        }
      }
    }
  }
}